

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O1

void __thiscall duckdb::ListColumnData::InitializeScan(ListColumnData *this,ColumnScanState *state)

{
  reference pvVar1;
  pointer pCVar2;
  undefined8 extraout_RDX;
  
  ColumnData::InitializeScan(&this->super_ColumnData,state);
  pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,0);
  ColumnData::InitializeScan(&(this->validity).super_ColumnData,pvVar1);
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,1);
  (*pCVar2->_vptr_ColumnData[7])(pCVar2,pvVar1,extraout_RDX,pCVar2->_vptr_ColumnData[7]);
  return;
}

Assistant:

void ListColumnData::InitializeScan(ColumnScanState &state) {
	ColumnData::InitializeScan(state);

	// initialize the validity segment
	D_ASSERT(state.child_states.size() == 2);
	validity.InitializeScan(state.child_states[0]);

	// initialize the child scan
	child_column->InitializeScan(state.child_states[1]);
}